

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O3

int MeasureText(char *text,int fontSize)

{
  Font font;
  ulong uVar1;
  float fVar2;
  Vector2 VVar3;
  
  if (defaultFont.texture.id == 0) {
    fVar2 = 0.0;
  }
  else {
    uVar1 = 10;
    if (10 < fontSize) {
      uVar1 = (ulong)(uint)fontSize;
    }
    font.texture.id = defaultFont.texture.id;
    font.charsPadding = defaultFont.charsPadding;
    font._0_8_ = defaultFont._0_8_;
    font.texture._4_8_ = defaultFont.texture._4_8_;
    font.texture._12_8_ = defaultFont.texture._12_8_;
    font.recs = defaultFont.recs;
    font.chars = defaultFont.chars;
    VVar3 = MeasureTextEx(font,text,(float)(int)uVar1,(float)(uint)(uVar1 * 0x66666667 >> 0x22));
    fVar2 = VVar3.x;
  }
  return (int)fVar2;
}

Assistant:

int MeasureText(const char *text, int fontSize)
{
    Vector2 vec = { 0.0f, 0.0f };

    // Check if default font has been loaded
    if (GetFontDefault().texture.id != 0)
    {
        int defaultFontSize = 10;   // Default Font chars height in pixel
        if (fontSize < defaultFontSize) fontSize = defaultFontSize;
        int spacing = fontSize/defaultFontSize;

        vec = MeasureTextEx(GetFontDefault(), text, (float)fontSize, (float)spacing);
    }

    return (int)vec.x;
}